

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KvsCommandHandler.hpp
# Opt level: O0

void __thiscall
supermap::cli::AddKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>::
AddKeyHandler(AddKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> *this,
             shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
             *kvs)

{
  shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  *in_RSI;
  undefined8 *in_RDI;
  shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  local_58;
  allocator<char> *in_stack_ffffffffffffffc0;
  shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  KvsCommandHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>
  *in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::
  shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  ::shared_ptr(in_RSI,&local_58);
  KvsCommandHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>::KvsCommandHandler
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8);
  std::
  shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  ::~shared_ptr((shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
                 *)0x13efeb);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  *in_RDI = &PTR_handle_0016e9b0;
  return;
}

Assistant:

explicit AddKeyHandler(std::shared_ptr<KeyValueStorage<Key, Value, Index>> kvs)
        : KvsCommandHandler<Key, Value, Index>("Add key to keys", 2, std::move(kvs)) {}